

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

ByteArray *
ot::commissioner::CommissionerImpl::GetBbrDatasetTlvs
          (ByteArray *__return_storage_ptr__,uint16_t aDatasetFlags)

{
  pointer *ppuVar1;
  iterator iVar2;
  uchar local_1b [3];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((short)aDatasetFlags < 0) {
    local_1b[2] = 0x43;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (__return_storage_ptr__,(iterator)0x0,local_1b + 2);
  }
  if ((aDatasetFlags >> 0xe & 1) != 0) {
    local_1b[1] = 0x45;
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,local_1b + 1);
    }
    else {
      *iVar2._M_current = 'E';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if ((aDatasetFlags >> 0xd & 1) != 0) {
    local_1b[0] = 'D';
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,local_1b);
    }
    else {
      *iVar2._M_current = 'D';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray CommissionerImpl::GetBbrDatasetTlvs(uint16_t aDatasetFlags)
{
    ByteArray tlvTypes;

    if (aDatasetFlags & BbrDataset::kTriHostnameBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kTriHostname));
    }

    if (aDatasetFlags & BbrDataset::kRegistrarHostnameBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kRegistrarHostname));
    }

    if (aDatasetFlags & BbrDataset::kRegistrarIpv6AddrBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kRegistrarIpv6Address));
    }
    return tlvTypes;
}